

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
::nosize_transfer_element
          (void *param_1,undefined8 param_2,undefined8 param_3,size_t param_4,long *param_5)

{
  moved_type mVar1;
  destroy_element_on_exit d;
  pair<unsigned_int_&&,_const_slang::ast::Type_*&&> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  
  *param_5 = *param_5 + 1;
  position_for(param_4,(arrays_type *)param_1);
  mVar1 = flat_map_types<unsigned_int,_const_slang::ast::Type_*>::move((element_type *)0x401f41);
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
  ::nosize_unchecked_emplace_at<std::pair<unsigned_int&&,slang::ast::Type_const*&&>>
            ((table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<unsigned_int,_void>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
              *)param_1,(arrays_type *)mVar1.second,(size_t)mVar1.first,in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0x401f8f);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }